

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::setTextBackgroundColor(QTextEdit *this,QColor *c)

{
  QColor *in_RSI;
  QBrush *in_RDI;
  long in_FS_OFFSET;
  QTextCharFormat fmt;
  QBrush *this_00;
  QTextFormat *this_01;
  QBrush local_20 [8];
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QTextFormat *)&local_18;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)this_01);
  this_00 = local_20;
  QBrush::QBrush(this_00,in_RSI,SolidPattern);
  QTextFormat::setBackground(this_01,in_RDI);
  QBrush::~QBrush(this_00);
  mergeCurrentCharFormat((QTextEdit *)in_RDI,(QTextCharFormat *)this_00);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x6d235d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::setTextBackgroundColor(const QColor &c)
{
    QTextCharFormat fmt;
    fmt.setBackground(QBrush(c));
    mergeCurrentCharFormat(fmt);
}